

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_add_handle(Curl_multi *multi,Curl_easy *data)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *pcVar3;
  Curl_share *pCVar4;
  Curl_easy *pCVar5;
  conncache *pcVar6;
  CURLMcode CVar7;
  
  CVar7 = CURLM_BAD_HANDLE;
  if (((((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) &&
       (CVar7 = CURLM_BAD_EASY_HANDLE, data != (Curl_easy *)0x0)) &&
      ((data->magic == 0xc0dedbad && (CVar7 = CURLM_ADDED_ALREADY, data->multi == (Curl_multi *)0x0)
       ))) && (CVar7 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    Curl_llist_init(&(data->state).timeoutlist,(curl_llist_dtor)0x0);
    pcVar3 = (data->set).errorbuffer;
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    if (data->mstate != CURLM_STATE_INIT) {
      data->mstate = CURLM_STATE_INIT;
    }
    if (((data->dns).hostcache == (curl_hash *)0x0) || ((data->dns).hostcachetype == HCACHE_NONE)) {
      (data->dns).hostcache = &multi->hostcache;
      (data->dns).hostcachetype = HCACHE_MULTI;
    }
    pCVar4 = data->share;
    if ((pCVar4 == (Curl_share *)0x0) || ((pCVar4->specifier & 0x20) == 0)) {
      pcVar6 = &multi->conn_cache;
    }
    else {
      pcVar6 = &pCVar4->conn_cache;
    }
    (data->state).conn_cache = pcVar6;
    data->next = (Curl_easy *)0x0;
    if (multi->easyp == (Curl_easy *)0x0) {
      data->prev = (Curl_easy *)0x0;
      multi->easyp = data;
    }
    else {
      pCVar5 = multi->easylp;
      pCVar5->next = data;
      data->prev = pCVar5;
    }
    multi->easylp = data;
    data->multi = multi;
    CVar7 = CURLM_OK;
    Curl_expire(data,0,EXPIRE_RUN_NOW);
    uVar1 = multi->num_easy;
    uVar2 = multi->num_alive;
    multi->num_easy = uVar1 + 1;
    multi->num_alive = uVar2 + 1;
    (multi->timer_lastcall).tv_sec = 0;
    (multi->timer_lastcall).tv_usec = 0;
    *(undefined4 *)&(multi->timer_lastcall).field_0xc = 0;
    pCVar5 = ((data->state).conn_cache)->closure_handle;
    (pCVar5->set).timeout = (data->set).timeout;
    (pCVar5->set).server_response_timeout = (data->set).server_response_timeout;
    *(ulong *)&(pCVar5->set).field_0x878 =
         *(ulong *)&(pCVar5->set).field_0x878 & 0xfffffffbffffffff |
         *(ulong *)&(data->set).field_0x878 & 0x400000000;
    update_timer(multi);
  }
  return CVar7;
}

Assistant:

CURLMcode curl_multi_add_handle(struct Curl_multi *multi,
                                struct Curl_easy *data)
{
  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from adding same easy handle more than once and prevent
     adding to more than one multi stack */
  if(data->multi)
    return CURLM_ADDED_ALREADY;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* Initialize timeout list for this handle */
  Curl_llist_init(&data->state.timeoutlist, NULL);

  /*
   * No failure allowed in this function beyond this point. And no
   * modification of easy nor multi handle allowed before this except for
   * potential multi's connection cache growing which won't be undone in this
   * function no matter what.
   */
  if(data->set.errorbuffer)
    data->set.errorbuffer[0] = 0;

  /* set the easy handle */
  multistate(data, CURLM_STATE_INIT);

  /* for multi interface connections, we share DNS cache automatically if the
     easy handle's one is currently not set. */
  if(!data->dns.hostcache ||
     (data->dns.hostcachetype == HCACHE_NONE)) {
    data->dns.hostcache = &multi->hostcache;
    data->dns.hostcachetype = HCACHE_MULTI;
  }

  /* Point to the shared or multi handle connection cache */
  if(data->share && (data->share->specifier & (1<< CURL_LOCK_DATA_CONNECT)))
    data->state.conn_cache = &data->share->conn_cache;
  else
    data->state.conn_cache = &multi->conn_cache;

#ifdef USE_LIBPSL
  /* Do the same for PSL. */
  if(data->share && (data->share->specifier & (1 << CURL_LOCK_DATA_PSL)))
    data->psl = &data->share->psl;
  else
    data->psl = &multi->psl;
#endif

  /* We add the new entry last in the list. */
  data->next = NULL; /* end of the line */
  if(multi->easyp) {
    struct Curl_easy *last = multi->easylp;
    last->next = data;
    data->prev = last;
    multi->easylp = data; /* the new last node */
  }
  else {
    /* first node, make prev NULL! */
    data->prev = NULL;
    multi->easylp = multi->easyp = data; /* both first and last */
  }

  /* make the Curl_easy refer back to this multi handle */
  data->multi = multi;

  /* Set the timeout for this handle to expire really soon so that it will
     be taken care of even when this handle is added in the midst of operation
     when only the curl_multi_socket() API is used. During that flow, only
     sockets that time-out or have actions will be dealt with. Since this
     handle has no action yet, we make sure it times out to get things to
     happen. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);

  /* increase the node-counter */
  multi->num_easy++;

  /* increase the alive-counter */
  multi->num_alive++;

  /* A somewhat crude work-around for a little glitch in update_timer() that
     happens if the lastcall time is set to the same time when the handle is
     removed as when the next handle is added, as then the check in
     update_timer() that prevents calling the application multiple times with
     the same timer info will not trigger and then the new handle's timeout
     will not be notified to the app.

     The work-around is thus simply to clear the 'lastcall' variable to force
     update_timer() to always trigger a callback to the app when a new easy
     handle is added */
  memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));

  /* The closure handle only ever has default timeouts set. To improve the
     state somewhat we clone the timeouts from each added handle so that the
     closure handle always has the same timeouts as the most recently added
     easy handle. */
  data->state.conn_cache->closure_handle->set.timeout = data->set.timeout;
  data->state.conn_cache->closure_handle->set.server_response_timeout =
    data->set.server_response_timeout;
  data->state.conn_cache->closure_handle->set.no_signal =
    data->set.no_signal;

  update_timer(multi);
  return CURLM_OK;
}